

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynarray.cpp
# Opt level: O1

void __thiscall DynArray::Add(DynArray *this,char *value)

{
  uint uVar1;
  uint uVar2;
  char *__src;
  uint uVar3;
  char *__dest;
  
  uVar1 = this->length;
  if (uVar1 == this->data_size) {
    uVar3 = this->data_size * 2;
    this->data_size = uVar3;
    uVar2 = this->elem_size;
    __dest = (char *)malloc((ulong)(uVar3 * uVar2));
    __src = this->data;
    memcpy(__dest,__src,(ulong)(uVar1 * uVar2));
    free(__src);
    this->data = __dest;
  }
  memcpy(this->data + this->length * this->elem_size,value,(ulong)this->elem_size);
  this->length = this->length + 1;
  return;
}

Assistant:

void
DynArray::Add(char *value)
{
  if (length == data_size) {
    data_size *= 2;

    char *new_data;
    new_data = (char *)malloc(data_size * elem_size);
    memcpy(new_data, data, length * elem_size);
    free(data);
    data = new_data;
  }

  // copy the data to the array
  memcpy(&data[length * elem_size], value, elem_size);
  length++;
}